

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspFacade::SolveData::prepareEnum
          (SolveData *this,SharedContext *ctx,EnumMode mode,EnumOptions *options)

{
  bool bVar1;
  SolveMode SVar2;
  Enumerator *this_00;
  SolveAlgorithm *this_01;
  uint64 *in_RCX;
  int in_EDX;
  SharedContext *in_RSI;
  long in_RDI;
  int lim;
  int64 numM;
  SumVec *in_stack_ffffffffffffff88;
  SharedContext *in_stack_ffffffffffffff90;
  SolveAlgorithm *this_02;
  SharedContext *in_stack_ffffffffffffffa0;
  Range<long> local_40;
  int local_2c;
  SolveAlgorithm *local_28;
  uint64 *local_20;
  int local_14;
  SharedContext *local_10;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_20 = in_RCX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    bVar1 = SharedContext::ok(in_stack_ffffffffffffff90);
    if (((bVar1) && (bVar1 = SharedContext::frozen(local_10), !bVar1)) &&
       ((*(byte *)(in_RDI + 0x5d) & 1) == 0)) {
      if ((local_14 == 0) && (SVar2 = SharedContext::solveMode(local_10), SVar2 == solve_multi)) {
        SharedContext::requestStepVar(in_stack_ffffffffffffffa0);
      }
      OutputTable::setProjectMode(&local_10->output,*(ProjectMode *)(local_20 + 2));
      local_28 = (SolveAlgorithm *)*local_20;
      this_00 = SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::operator->
                          ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x1224c2);
      Range<long>::Range(&local_40,-1,0x7fffffff);
      Range<long>::clamp(&local_40,(long)local_28);
      local_2c = Enumerator::init(this_00,(EVP_PKEY_CTX *)local_10);
      if ((local_2c == 0) || ((long)*local_20 < 0)) {
        local_28 = (SolveAlgorithm *)(long)local_2c;
      }
      this_01 = SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::operator->
                          ((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)0x122545);
      this_02 = local_28;
      if (local_28 == (SolveAlgorithm *)0x0) {
        this_02 = (SolveAlgorithm *)0xffffffffffffffff;
      }
      SolveAlgorithm::setEnumLimit(this_01,(uint64)this_02);
      SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject>::operator->
                ((SingleOwnerPtr<Clasp::SolveAlgorithm,_Clasp::DeleteObject> *)0x122589);
      SolveAlgorithm::setOptLimit(this_02,in_stack_ffffffffffffff88);
      *(undefined1 *)(in_RDI + 0x5d) = 1;
    }
    return;
  }
  Potassco::fail(-2,
                 "void Clasp::ClaspFacade::SolveData::prepareEnum(SharedContext &, EnumMode, const EnumOptions &)"
                 ,0x20e,"!active","Solve operation still active",0);
}

Assistant:

void ClaspFacade::SolveData::prepareEnum(SharedContext& ctx, EnumMode mode, const EnumOptions& options) {
	POTASSCO_REQUIRE(!active, "Solve operation still active");
	if (ctx.ok() && !ctx.frozen() && !prepared) {
		if (mode == enum_volatile && ctx.solveMode() == SharedContext::solve_multi) {
			ctx.requestStepVar();
		}
		ctx.output.setProjectMode(options.proMode);
		int64 numM = options.numModels;
		int lim = en->init(ctx, options.optMode, (int)Range<int64>(-1, INT_MAX).clamp(numM));
		if (lim == 0 || options.numModels < 0) {
			numM = lim;
		}
		algo->setEnumLimit(numM ? static_cast<uint64>(numM) : UINT64_MAX);
		algo->setOptLimit(options.optStop);
		prepared = true;
	}
}